

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_machoread.c
# Opt level: O0

int macho_load_section(void *obj,Dwarf_Unsigned section_index,Dwarf_Small **return_data,int *error)

{
  long lVar1;
  long lVar2;
  void *pvVar3;
  generic_macho_section *sp;
  Dwarf_Unsigned inner;
  int res;
  dwarf_macho_object_access_internals_t *macho;
  int *error_local;
  Dwarf_Small **return_data_local;
  Dwarf_Unsigned section_index_local;
  void *obj_local;
  
  if ((section_index == 0) || (*(ulong *)((long)obj + 200) <= section_index)) {
    obj_local._4_4_ = -1;
  }
  else {
    lVar1 = *(long *)((long)obj + 0x30);
    lVar2 = *(long *)((long)obj + 0xd0) + section_index * 0xa0;
    if (*(long *)(lVar2 + 0x98) == 0) {
      if (*(long *)(lVar2 + 0x40) == 0) {
        obj_local._4_4_ = -1;
      }
      else if (*(ulong *)((long)obj + 0x18) <
               (ulong)(*(long *)(lVar2 + 0x40) + *(long *)(lVar2 + 0x48))) {
        *error = 0x1a7;
        obj_local._4_4_ = 1;
      }
      else {
        pvVar3 = malloc(*(size_t *)(lVar2 + 0x40));
        *(void **)(lVar2 + 0x98) = pvVar3;
        if (*(long *)(lVar2 + 0x98) == 0) {
          *error = 0x3e;
          obj_local._4_4_ = 1;
        }
        else {
          obj_local._4_4_ =
               _dwarf_object_read_random
                         (*(int *)((long)obj + 0x10),*(char **)(lVar2 + 0x98),
                          lVar1 + *(long *)(lVar2 + 0x48),*(Dwarf_Unsigned *)(lVar2 + 0x40),
                          lVar1 + *(long *)((long)obj + 0x18),error);
          if (obj_local._4_4_ == 0) {
            *return_data = *(Dwarf_Small **)(lVar2 + 0x98);
            obj_local._4_4_ = 0;
          }
          else {
            free(*(void **)(lVar2 + 0x98));
            *(undefined8 *)(lVar2 + 0x98) = 0;
          }
        }
      }
    }
    else {
      *return_data = *(Dwarf_Small **)(lVar2 + 0x98);
      obj_local._4_4_ = 0;
    }
  }
  return obj_local._4_4_;
}

Assistant:

static int
macho_load_section (void *obj, Dwarf_Unsigned section_index,
    Dwarf_Small **return_data, int *error)
{
    dwarf_macho_object_access_internals_t *macho =
        (dwarf_macho_object_access_internals_t*)(obj);

    if (0 < section_index &&
        section_index < macho->mo_dwarf_sectioncount) {
        int res = 0;
        Dwarf_Unsigned inner = macho->mo_inner_offset;

        struct generic_macho_section *sp =
            macho->mo_dwarf_sections + section_index;
        if (sp->loaded_data) {
            *return_data = sp->loaded_data;
            return DW_DLV_OK;
        }
        if (!sp->size) {
            return DW_DLV_NO_ENTRY;
        }
        if ((sp->size + sp->offset) >
            macho->mo_filesize) {
            *error = DW_DLE_FILE_TOO_SMALL;
            return DW_DLV_ERROR;
        }

        sp->loaded_data = malloc((size_t)sp->size);
        if (!sp->loaded_data) {
            *error = DW_DLE_ALLOC_FAIL;
            return DW_DLV_ERROR;
        }
        res = RRMOA(macho->mo_fd,
            sp->loaded_data, (inner+sp->offset),
            sp->size,
            (inner+macho->mo_filesize), error);
        if (res != DW_DLV_OK) {
            free(sp->loaded_data);
            sp->loaded_data = 0;
            return res;
        }
        *return_data = sp->loaded_data;
        return DW_DLV_OK;
    }
    return DW_DLV_NO_ENTRY;
}